

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O3

string * deqp::gles2::Performance::anon_unknown_1::FunctionCase::incrementExpr
                   (string *__return_storage_ptr__,string *baseExpr,DataType type,bool divide)

{
  pointer pcVar1;
  long lVar2;
  string *extraout_RAX;
  long *plVar3;
  string *extraout_RAX_00;
  string *psVar4;
  string *extraout_RAX_01;
  undefined7 in_register_00000009;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  string mulOrDiv;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30 [2];
  
  pcVar8 = "*";
  bVar9 = (int)CONCAT71(in_register_00000009,divide) != 0;
  if (bVar9) {
    pcVar8 = "/";
  }
  pcVar7 = "";
  if (bVar9) {
    pcVar7 = "";
  }
  local_40._M_allocated_capacity = (size_type)local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar8,pcVar7);
  if (type - TYPE_BOOL < 4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (baseExpr->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + baseExpr->_M_string_length);
    psVar4 = extraout_RAX;
  }
  else {
    if (type - TYPE_INT < 4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "(",baseExpr);
      plVar3 = (long *)std::__cxx11::string::_M_append(local_60,local_40._M_allocated_capacity);
      local_80 = &local_70;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_70 = *plVar5;
        lStack_68 = plVar3[3];
      }
      else {
        local_70 = *plVar5;
        local_80 = (long *)*plVar3;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "(",baseExpr);
      plVar3 = (long *)std::__cxx11::string::_M_append(local_60,local_40._M_allocated_capacity);
      local_80 = &local_70;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_70 = *plVar5;
        lStack_68 = plVar3[3];
      }
      else {
        local_70 = *plVar5;
        local_80 = (long *)*plVar3;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    psVar4 = (string *)(local_60 + 0x10);
    if ((string *)local_60._0_8_ != psVar4) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      psVar4 = extraout_RAX_00;
    }
  }
  if ((long *)local_40._M_allocated_capacity != local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30[0] + 1);
    psVar4 = extraout_RAX_01;
  }
  return psVar4;
}

Assistant:

string FunctionCase::incrementExpr (const string& baseExpr, glu::DataType type, bool divide)
{
	const string mulOrDiv = divide ? "/" : "*";

	return glu::isDataTypeBoolOrBVec(type)	? baseExpr
		 : glu::isDataTypeIntOrIVec(type)	? "(" + baseExpr + mulOrDiv + "(i+1))"
		 :									  "(" + baseExpr + mulOrDiv + "float(i+1))";
}